

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timebase_helper.c
# Opt level: O0

target_ulong helper_load_dcr_ppc64(CPUPPCState_conflict2 *env,target_ulong dcrn)

{
  int iVar1;
  uintptr_t unaff_retaddr;
  uint32_t local_1c;
  int ret;
  uint32_t val;
  target_ulong dcrn_local;
  CPUPPCState_conflict2 *env_local;
  
  local_1c = 0;
  _ret = dcrn;
  dcrn_local = (target_ulong)env;
  if (env->dcr_env == (ppc_dcr_t *)0x0) {
    raise_exception_err_ra_ppc64(env,6,0x21,unaff_retaddr);
  }
  iVar1 = ppc_dcr_read_ppc64(env->dcr_env,(int)dcrn,&local_1c);
  if (iVar1 != 0) {
    raise_exception_err_ra_ppc64((CPUPPCState_conflict2 *)dcrn_local,6,0x22,unaff_retaddr);
  }
  return (ulong)local_1c;
}

Assistant:

target_ulong helper_load_dcr(CPUPPCState *env, target_ulong dcrn)
{
    uint32_t val = 0;

    if (unlikely(env->dcr_env == NULL)) {
        qemu_log_mask(LOG_GUEST_ERROR, "No DCR environment\n");
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    } else {
        int ret;

        ret = ppc_dcr_read(env->dcr_env, (uint32_t)dcrn, &val);
        if (unlikely(ret != 0)) {
#if 0
            qemu_log_mask(LOG_GUEST_ERROR, "DCR read error %d %03x\n",
                          (uint32_t)dcrn, (uint32_t)dcrn);
#endif
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_PRIV_REG, GETPC());
        }
    }
    return val;
}